

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void pnga_sprs_array_matvec_multiply(Integer s_a,Integer g_a,Integer g_v)

{
  double *pdVar1;
  int *piVar2;
  long *plVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 (*__s) [16];
  void *buf;
  Integer iproc;
  int iVar14;
  long lVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  Integer IVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  Integer ihi;
  Integer ilo;
  Integer khi;
  Integer klo;
  Integer one;
  Integer jhi;
  Integer jlo;
  int *jptr;
  int *iptr;
  int64_t *jlptr;
  int64_t *ilptr;
  void *vptr;
  Integer vtype;
  Integer atype;
  Integer vrank;
  double one_r;
  Integer arank;
  Integer dims [7];
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  Integer local_120;
  long local_118;
  Integer local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  Integer local_d0;
  long local_c8;
  long local_c0;
  Integer local_b8;
  Integer local_b0;
  Integer local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80 [3];
  long local_68 [7];
  
  lVar18 = s_a + 1000;
  IVar26 = SPA[lVar18].grp;
  local_120 = g_a;
  local_d0 = pnga_pgroup_nodeid(IVar26);
  local_b8 = pnga_pgroup_nnodes(IVar26);
  local_98 = (ulong)(uint)SPA[lVar18].idx_size;
  local_e0 = 0;
  local_e8 = 0;
  local_f0 = 0;
  local_f8 = 0;
  local_80[1] = 0x3ff0000000000000;
  local_110 = 1;
  lVar23 = (long)_ga_sync_begin;
  lVar15 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_d8 = lVar18 * 200;
  if (lVar23 != 0) {
    pnga_pgroup_sync(IVar26);
  }
  local_a8 = IVar26;
  pnga_inquire(local_120,&local_88,local_80 + 2,local_68);
  lVar18 = local_68[0];
  pnga_inquire(g_v,&local_90,local_80,local_68);
  if (local_80[2] != 1) {
    pnga_error("rank of A must be 1 (vector)",local_80[2]);
  }
  if (local_80[0] != 1) {
    pnga_error("rank of V must be 1 (vector)",local_80[0]);
  }
  if (lVar18 != *(long *)((long)&SPA->jdim + local_d8)) {
    pnga_error("length of A must equal second dimension of sparse matrix",lVar18);
  }
  if (local_68[0] != *(long *)((long)&SPA->jdim + local_d8)) {
    pnga_error("length of V must equal second dimension of sparse matrix",local_68[0]);
  }
  lVar18 = *(long *)((long)&SPA->type + local_d8);
  if ((local_88 != lVar18) || (local_90 != lVar18)) {
    pnga_error("Data type of sparse matrix and A and V vectors must match",lVar18);
  }
  if (*(long *)((long)&SPA->type + local_d8) == 0x3f8) {
    pnga_error("Data type of sparse matrix and A and V vectors cannot be of type long long",0x3f8);
  }
  local_a0 = lVar15;
  pnga_mask_sync(lVar23,lVar15);
  local_b0 = g_v;
  pnga_zero(g_v);
  pnga_sprs_array_row_distribution(s_a,local_d0,&local_138,&local_140);
  __s = (undefined1 (*) [16])
        malloc(((local_140 - local_138) + 1) * *(long *)((long)&SPA->size + local_d8));
  if (0 < local_b8) {
    bVar27 = true;
    iproc = 0;
    IVar26 = local_120;
    do {
      pnga_sprs_array_column_distribution(s_a,iproc,&local_100,&local_108);
      if ((int)local_98 == 4) {
        pnga_sprs_array_access_col_block(s_a,iproc,&local_f0,&local_f8,&local_c0);
        lVar23 = local_c0;
        lVar15 = local_100;
        lVar18 = local_108;
        if (local_c0 != 0) {
          local_d0 = iproc;
          switch(*(undefined8 *)((long)&SPA->type + local_d8)) {
          case 0x3e9:
            local_118 = local_108;
            buf = malloc((local_108 - local_100) * 4 + 4);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 4 + 4);
            }
            local_128 = lVar15 + 1;
            local_130 = local_118 + 1;
            pnga_get(IVar26,&local_128,&local_130,buf,&local_110);
            lVar18 = local_138;
            if (local_138 <= local_140) {
              do {
                iVar14 = *(int *)(local_f0 + ((lVar18 + 1) - local_138) * 4);
                lVar19 = lVar18 - local_138;
                iVar8 = *(int *)(local_f0 + lVar19 * 4);
                uVar20 = iVar14 - iVar8;
                if (uVar20 != 0 && iVar8 <= iVar14) {
                  uVar25 = 0;
                  do {
                    lVar22 = (long)*(int *)(local_f0 + lVar19 * 4) + uVar25;
                    piVar2 = (int *)((long)__s + lVar19 * 4);
                    *piVar2 = *piVar2 + *(int *)((long)buf +
                                                (*(int *)(local_f8 + lVar22 * 4) - lVar15) * 4) *
                                        *(int *)(lVar23 + lVar22 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar20 != uVar25);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
            break;
          case 0x3ea:
            local_118 = local_108;
            buf = malloc((local_108 - local_100) * 8 + 8);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 8 + 8);
            }
            local_128 = lVar15 + 1;
            local_130 = local_118 + 1;
            pnga_get(IVar26,&local_128,&local_130,buf,&local_110);
            local_118 = local_140;
            if (local_138 <= local_140) {
              local_c8 = local_f8;
              lVar18 = local_138;
              do {
                iVar14 = *(int *)(local_f0 + ((lVar18 + 1) - local_138) * 4);
                lVar19 = lVar18 - local_138;
                iVar8 = *(int *)(local_f0 + lVar19 * 4);
                uVar20 = iVar14 - iVar8;
                if (uVar20 != 0 && iVar8 <= iVar14) {
                  lVar22 = *(long *)((long)__s + lVar19 * 8);
                  uVar25 = 0;
                  do {
                    lVar22 = lVar22 + *(long *)((long)buf +
                                               (*(int *)(local_f8 + (long)iVar8 * 4 + uVar25 * 4) -
                                               lVar15) * 8) *
                                      *(long *)(lVar23 + (long)iVar8 * 8 + uVar25 * 8);
                    *(long *)((long)__s + lVar19 * 8) = lVar22;
                    uVar25 = uVar25 + 1;
                  } while (uVar20 != uVar25);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
            break;
          case 0x3eb:
            local_118 = local_108;
            buf = malloc((local_108 - local_100) * 4 + 4);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 4 + 4);
            }
            local_128 = lVar15 + 1;
            local_130 = local_118 + 1;
            pnga_get(IVar26,&local_128,&local_130,buf,&local_110);
            if (local_138 <= local_140) {
              local_118 = local_f8;
              lVar18 = local_138;
              do {
                iVar14 = *(int *)(local_f0 + ((lVar18 + 1) - local_138) * 4);
                lVar19 = lVar18 - local_138;
                iVar8 = *(int *)(local_f0 + lVar19 * 4);
                uVar20 = iVar14 - iVar8;
                if (uVar20 != 0 && iVar8 <= iVar14) {
                  fVar28 = *(float *)((long)__s + lVar19 * 4);
                  uVar25 = 0;
                  do {
                    fVar28 = fVar28 + *(float *)(lVar23 + (long)iVar8 * 4 + uVar25 * 4) *
                                      *(float *)((long)buf +
                                                (*(int *)(local_f8 + (long)iVar8 * 4 + uVar25 * 4) -
                                                lVar15) * 4);
                    *(float *)((long)__s + lVar19 * 4) = fVar28;
                    uVar25 = uVar25 + 1;
                  } while (uVar20 != uVar25);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
            break;
          case 0x3ec:
            buf = malloc((local_108 - local_100) * 8 + 8);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 8 + 8);
            }
            IVar26 = local_120;
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(local_120,&local_128,&local_130,buf,&local_110);
            if (local_138 <= local_140) {
              local_118 = local_f8;
              lVar18 = local_138;
              do {
                iVar14 = *(int *)(local_f0 + ((lVar18 + 1) - local_138) * 4);
                lVar19 = lVar18 - local_138;
                iVar8 = *(int *)(local_f0 + lVar19 * 4);
                uVar20 = iVar14 - iVar8;
                if (uVar20 != 0 && iVar8 <= iVar14) {
                  dVar5 = *(double *)((long)__s + lVar19 * 8);
                  uVar25 = 0;
                  do {
                    dVar5 = dVar5 + *(double *)(lVar23 + (long)iVar8 * 8 + uVar25 * 8) *
                                    *(double *)
                                     ((long)buf +
                                     (*(int *)(local_f8 + (long)iVar8 * 4 + uVar25 * 4) - lVar15) *
                                     8);
                    *(double *)((long)__s + lVar19 * 8) = dVar5;
                    uVar25 = uVar25 + 1;
                  } while (uVar20 != uVar25);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
            break;
          default:
            goto switchD_00146b46_caseD_3ed;
          case 0x3ee:
            buf = malloc((local_108 - local_100) * 8 + 8);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 8 + 8);
            }
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(IVar26,&local_128,&local_130,buf,&local_110);
            if (local_138 <= local_140) {
              lVar18 = 0;
              do {
                iVar14 = *(int *)(local_f0 + 4 + lVar18 * 4);
                iVar8 = *(int *)(local_f0 + lVar18 * 4);
                uVar20 = iVar14 - iVar8;
                if (uVar20 != 0 && iVar8 <= iVar14) {
                  lVar23 = (ulong)uVar20 + (long)iVar8;
                  fVar28 = *(float *)((long)buf + lVar23 * 8 + -8);
                  fVar4 = *(float *)((long)buf + lVar23 * 8 + -4);
                  uVar7 = *(undefined8 *)
                           ((long)buf + (*(int *)(local_f8 + -4 + lVar23 * 4) - lVar15) * 8);
                  fVar29 = (float)uVar7;
                  fVar30 = (float)((ulong)uVar7 >> 0x20);
                  *(ulong *)(*__s + lVar18 * 8) =
                       CONCAT44(fVar28 * fVar30 + fVar29 * fVar4,fVar28 * fVar29 + fVar30 * -fVar4);
                }
                lVar18 = lVar18 + 1;
              } while ((local_140 - local_138) + 1 != lVar18);
            }
            break;
          case 0x3ef:
            buf = malloc((local_108 - local_100) * 0x10 + 0x10);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 0x10 + 0x10);
            }
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(IVar26,&local_128,&local_130,buf,&local_110);
            if (local_138 <= local_140) {
              lVar18 = 0;
              pauVar17 = __s;
              do {
                iVar14 = *(int *)(local_f0 + 4 + lVar18 * 4);
                iVar8 = *(int *)(local_f0 + lVar18 * 4);
                uVar20 = iVar14 - iVar8;
                if (uVar20 != 0 && iVar8 <= iVar14) {
                  lVar23 = ((long)iVar8 + (ulong)uVar20 + -1) * 0x10;
                  dVar5 = *(double *)((long)buf + lVar23);
                  dVar6 = *(double *)((long)buf + lVar23 + 8);
                  pdVar1 = (double *)
                           ((long)buf +
                           (*(int *)(local_f8 + -4 + ((ulong)uVar20 + (long)iVar8) * 4) - lVar15) *
                           0x10);
                  dVar12 = *pdVar1;
                  dVar13 = pdVar1[1];
                  dVar11 = dVar5 * dVar13 + dVar12 * dVar6;
                  auVar9._8_4_ = SUB84(dVar11,0);
                  auVar9._0_8_ = dVar5 * dVar12 + dVar13 * -dVar6;
                  auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
                  *pauVar17 = auVar9;
                }
                lVar18 = lVar18 + 1;
                pauVar17 = pauVar17 + 1;
              } while ((local_140 - local_138) + 1 != lVar18);
            }
            break;
          case 0x3f8:
            local_118 = local_108;
            buf = malloc((local_108 - local_100) * 8 + 8);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 8 + 8);
            }
            local_128 = lVar15 + 1;
            local_130 = local_118 + 1;
            pnga_get(IVar26,&local_128,&local_130,buf,&local_110);
            local_118 = local_140;
            if (local_138 <= local_140) {
              local_c8 = local_f8;
              lVar18 = local_138;
              do {
                iVar14 = *(int *)(local_f0 + ((lVar18 + 1) - local_138) * 4);
                lVar19 = lVar18 - local_138;
                iVar8 = *(int *)(local_f0 + lVar19 * 4);
                uVar20 = iVar14 - iVar8;
                if (uVar20 != 0 && iVar8 <= iVar14) {
                  lVar22 = *(long *)((long)__s + lVar19 * 8);
                  uVar25 = 0;
                  do {
                    lVar22 = lVar22 + *(long *)((long)buf +
                                               (*(int *)(local_f8 + (long)iVar8 * 4 + uVar25 * 4) -
                                               lVar15) * 8) *
                                      *(long *)(lVar23 + (long)iVar8 * 8 + uVar25 * 8);
                    *(long *)((long)__s + lVar19 * 8) = lVar22;
                    uVar25 = uVar25 + 1;
                  } while (uVar20 != uVar25);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
          }
LAB_0014778e:
          free(buf);
          bVar27 = false;
          iproc = local_d0;
        }
      }
      else {
        pnga_sprs_array_access_col_block(s_a,iproc,&local_e0,&local_e8,&local_c0);
        lVar23 = local_c0;
        lVar15 = local_100;
        lVar18 = local_108;
        if (local_c0 != 0) {
          local_d0 = iproc;
          switch(*(undefined8 *)((long)&SPA->type + local_d8)) {
          case 0x3e9:
            buf = malloc((local_108 - local_100) * 4 + 4);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 4 + 4);
            }
            IVar26 = local_120;
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(local_120,&local_128,&local_130,buf,&local_110);
            lVar18 = local_138;
            if (local_138 <= local_140) {
              do {
                lVar19 = *(long *)(local_e0 + ((lVar18 + 1) - local_138) * 8);
                lVar21 = lVar18 - local_138;
                lVar22 = *(long *)(local_e0 + lVar21 * 8);
                if (lVar22 < lVar19) {
                  iVar14 = *(int *)((long)__s + lVar21 * 4);
                  do {
                    iVar14 = iVar14 + *(int *)((long)buf +
                                              (*(long *)(local_e8 + lVar22 * 8) - lVar15) * 4) *
                                      *(int *)(lVar23 + lVar22 * 4);
                    *(int *)((long)__s + lVar21 * 4) = iVar14;
                    lVar22 = lVar22 + 1;
                  } while (lVar19 != lVar22);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
            break;
          case 0x3ea:
            buf = malloc((local_108 - local_100) * 8 + 8);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 8 + 8);
            }
            IVar26 = local_120;
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(local_120,&local_128,&local_130,buf,&local_110);
            lVar18 = local_138;
            if (local_138 <= local_140) {
              do {
                lVar19 = *(long *)(local_e0 + ((lVar18 + 1) - local_138) * 8);
                lVar21 = lVar18 - local_138;
                lVar22 = *(long *)(local_e0 + lVar21 * 8);
                if (lVar22 < lVar19) {
                  lVar16 = 0;
                  do {
                    lVar24 = *(long *)(local_e0 + lVar21 * 8) + lVar16;
                    plVar3 = (long *)((long)__s + lVar21 * 8);
                    *plVar3 = *plVar3 + *(long *)((long)buf +
                                                 (*(long *)(local_e8 + lVar24 * 8) - lVar15) * 8) *
                                        *(long *)(lVar23 + lVar24 * 8);
                    lVar16 = lVar16 + 1;
                  } while (lVar19 - lVar22 != lVar16);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
            break;
          case 0x3eb:
            buf = malloc((local_108 - local_100) * 4 + 4);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 4 + 4);
            }
            IVar26 = local_120;
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(local_120,&local_128,&local_130,buf,&local_110);
            lVar18 = local_138;
            if (local_138 <= local_140) {
              do {
                lVar19 = *(long *)(local_e0 + ((lVar18 + 1) - local_138) * 8);
                lVar21 = lVar18 - local_138;
                lVar22 = *(long *)(local_e0 + lVar21 * 8);
                if (lVar22 < lVar19) {
                  fVar28 = *(float *)((long)__s + lVar21 * 4);
                  do {
                    fVar28 = fVar28 + *(float *)(lVar23 + lVar22 * 4) *
                                      *(float *)((long)buf +
                                                (*(long *)(local_e8 + lVar22 * 8) - lVar15) * 4);
                    *(float *)((long)__s + lVar21 * 4) = fVar28;
                    lVar22 = lVar22 + 1;
                  } while (lVar19 != lVar22);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
            break;
          case 0x3ec:
            buf = malloc((local_108 - local_100) * 8 + 8);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 8 + 8);
            }
            IVar26 = local_120;
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(local_120,&local_128,&local_130,buf,&local_110);
            lVar18 = local_138;
            if (local_138 <= local_140) {
              do {
                lVar19 = *(long *)(local_e0 + ((lVar18 + 1) - local_138) * 8);
                lVar21 = lVar18 - local_138;
                lVar22 = *(long *)(local_e0 + lVar21 * 8);
                if (lVar22 < lVar19) {
                  dVar5 = *(double *)((long)__s + lVar21 * 8);
                  do {
                    dVar5 = dVar5 + *(double *)(lVar23 + lVar22 * 8) *
                                    *(double *)
                                     ((long)buf + (*(long *)(local_e8 + lVar22 * 8) - lVar15) * 8);
                    *(double *)((long)__s + lVar21 * 8) = dVar5;
                    lVar22 = lVar22 + 1;
                  } while (lVar19 != lVar22);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
            break;
          default:
            goto switchD_00146b46_caseD_3ed;
          case 0x3ee:
            buf = malloc((local_108 - local_100) * 8 + 8);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 8 + 8);
            }
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(IVar26,&local_128,&local_130,buf,&local_110);
            if (local_138 <= local_140) {
              lVar18 = 0;
              do {
                lVar23 = *(long *)(local_e0 + 8 + lVar18 * 8);
                if (*(long *)(local_e0 + lVar18 * 8) < lVar23) {
                  fVar28 = *(float *)((long)buf + lVar23 * 8 + -8);
                  fVar4 = *(float *)((long)buf + lVar23 * 8 + -4);
                  uVar7 = *(undefined8 *)
                           ((long)buf + (*(long *)(local_e8 + -8 + lVar23 * 8) - lVar15) * 8);
                  fVar29 = (float)uVar7;
                  fVar30 = (float)((ulong)uVar7 >> 0x20);
                  *(ulong *)(*__s + lVar18 * 8) =
                       CONCAT44(fVar28 * fVar30 + fVar29 * fVar4,fVar28 * fVar29 + fVar30 * -fVar4);
                }
                lVar18 = lVar18 + 1;
              } while ((local_140 - local_138) + 1 != lVar18);
            }
            break;
          case 0x3ef:
            buf = malloc((local_108 - local_100) * 0x10 + 0x10);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 0x10 + 0x10);
            }
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(IVar26,&local_128,&local_130,buf,&local_110);
            if (local_138 <= local_140) {
              lVar18 = 0;
              pauVar17 = __s;
              do {
                lVar23 = *(long *)(local_e0 + 8 + lVar18 * 8);
                if (*(long *)(local_e0 + lVar18 * 8) < lVar23) {
                  lVar19 = (lVar23 + -1) * 0x10;
                  dVar5 = *(double *)((long)buf + lVar19);
                  dVar6 = *(double *)((long)buf + lVar19 + 8);
                  pdVar1 = (double *)
                           ((long)buf + (*(long *)(local_e8 + -8 + lVar23 * 8) - lVar15) * 0x10);
                  dVar12 = *pdVar1;
                  dVar13 = pdVar1[1];
                  dVar11 = dVar5 * dVar13 + dVar12 * dVar6;
                  auVar10._8_4_ = SUB84(dVar11,0);
                  auVar10._0_8_ = dVar5 * dVar12 + dVar13 * -dVar6;
                  auVar10._12_4_ = (int)((ulong)dVar11 >> 0x20);
                  *pauVar17 = auVar10;
                }
                lVar18 = lVar18 + 1;
                pauVar17 = pauVar17 + 1;
              } while ((local_140 - local_138) + 1 != lVar18);
            }
            break;
          case 0x3f8:
            buf = malloc((local_108 - local_100) * 8 + 8);
            if ((bVar27) && (local_138 <= local_140)) {
              memset(__s,0,(local_140 - local_138) * 8 + 8);
            }
            IVar26 = local_120;
            local_128 = lVar15 + 1;
            local_130 = lVar18 + 1;
            pnga_get(local_120,&local_128,&local_130,buf,&local_110);
            lVar18 = local_138;
            if (local_138 <= local_140) {
              do {
                lVar19 = *(long *)(local_e0 + ((lVar18 + 1) - local_138) * 8);
                lVar21 = lVar18 - local_138;
                lVar22 = *(long *)(local_e0 + lVar21 * 8);
                if (lVar22 < lVar19) {
                  lVar16 = *(long *)((long)__s + lVar21 * 8);
                  do {
                    lVar16 = lVar16 + *(long *)((long)buf +
                                               (*(long *)(local_e8 + lVar22 * 8) - lVar15) * 8) *
                                      *(long *)(lVar23 + lVar22 * 8);
                    *(long *)((long)__s + lVar21 * 8) = lVar16;
                    lVar22 = lVar22 + 1;
                  } while (lVar19 != lVar22);
                }
                bVar27 = lVar18 != local_140;
                lVar18 = lVar18 + 1;
                IVar26 = local_120;
              } while (bVar27);
            }
          }
          goto LAB_0014778e;
        }
      }
switchD_00146b46_caseD_3ed:
      iproc = iproc + 1;
    } while (iproc != local_b8);
  }
  if (local_138 <= local_140) {
    local_128 = local_138 + 1;
    local_130 = local_140 + 1;
    pnga_acc(local_b0,&local_128,&local_130,__s,&local_110,local_80 + 1);
  }
  if ((int)local_a0 != 0) {
    pnga_pgroup_sync(local_a8);
  }
  free(__s);
  return;
}

Assistant:

void pnga_sprs_array_matvec_multiply(Integer s_a, Integer g_a, Integer g_v)
{
  Integer s_hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer s_grp = SPA[s_hdl].grp;
  Integer me = pnga_pgroup_nodeid(s_grp);
  Integer nproc = pnga_pgroup_nnodes(s_grp);

  Integer ilo, ihi, jlo, jhi, klo, khi;
  void  *vsum, *vptr;
  int idx_size = SPA[s_hdl].idx_size;
  int64_t *ilptr = NULL, *jlptr = NULL;
  int *iptr = NULL, *jptr = NULL;
  Integer i, j, iproc, ncols;
  double one_r = 1.0;
  Integer one = 1;
  Integer adim, vdim, arank, vrank, dims[GA_MAX_DIM];
  Integer atype, vtype;
  Integer zflag;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(s_grp);
  /* Check that g_hdl and v_hdl are both vectors and that sizes
   * match */
  pnga_inquire(g_a, &atype, &arank, dims);
  adim = dims[0];
  pnga_inquire(g_v, &vtype, &vrank, dims);
  vdim = dims[0];
  if (arank != 1) pnga_error("rank of A must be 1 (vector)",arank);
  if (vrank != 1) pnga_error("rank of V must be 1 (vector)",vrank);
  if (adim != SPA[s_hdl].jdim) {
    pnga_error("length of A must equal second dimension of sparse matrix",adim);
  }
  if (vdim != SPA[s_hdl].jdim) {
    pnga_error("length of V must equal second dimension of sparse matrix",vdim);
  }
  if (atype != SPA[s_hdl].type || vtype != SPA[s_hdl].type) {
    pnga_error("Data type of sparse matrix and A and V vectors must match",
        SPA[s_hdl].type);
  }
  /* accumulate operation does not support type C_LONGLONG so fail if this
   * data type encountered */
  if (SPA[s_hdl].type == C_LONGLONG) {
    pnga_error("Data type of sparse matrix and A and V vectors"
        " cannot be of type long long",SPA[s_hdl].type);
  }


#define SPRS_REAL_MULTIPLY_M(_type,_iptr,_jptr)              \
  {                                                          \
    _type *_buf = (_type*)malloc((jhi-jlo+1)*sizeof(_type)); \
    _type *_sum = (_type*)vsum;                              \
    _type *_ptr = (_type*)vptr;                              \
    if (zflag) {                                             \
      for (i=ilo; i<=ihi; i++) {                             \
        _sum[i-ilo] = (_type)0;                              \
      }                                                      \
      zflag = 0;                                             \
    }                                                        \
    klo = jlo+1;                                             \
    khi = jhi+1;                                             \
    pnga_get(g_a,&klo,&khi,_buf,&one);                       \
    for (i=ilo; i<=ihi; i++) {                               \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                   \
      for (j=0; j<ncols; j++) {                              \
        _sum[i-ilo] += _ptr[_iptr[i-ilo]+j]                  \
                     * _buf[_jptr[_iptr[i-ilo]+j]-jlo];      \
      }                                                      \
    }                                                        \
    free(_buf);                                              \
  }
  
#define SPRS_COMPLEX_MULTIPLY_M(_type,_iptr,_jptr)             \
  {                                                            \
    _type *_buf = (_type*)malloc((jhi-jlo+1)*2*sizeof(_type)); \
    _type *_sum = (_type*)vsum;                                \
    _type *_ptr = (_type*)vptr;                                \
    _type rbuf,ibuf,rval,ival;                                 \
    if (zflag) {                                               \
      for (i=ilo; i<=ihi; i++) {                               \
        _sum[2*(i-ilo)] = 0.0;                                 \
        _sum[2*(i-ilo)+1] = 0.0;                               \
      }                                                        \
      zflag = 0;                                               \
    }                                                          \
    klo = jlo+1;                                               \
    khi = jhi+1;                                               \
    pnga_get(g_a,&klo,&khi,_buf,&one);                         \
    for (i=ilo; i<=ihi; i++) {                                 \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                     \
      for (j=0; j<ncols; j++) {                                \
            rbuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)];        \
            ibuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)+1];      \
            rval = _buf[2*(_iptr[i-ilo]+j)];                   \
            ival = _buf[2*(_iptr[i-ilo]+j)+1];                 \
            _sum[2*(i-ilo)] = rval*rbuf-ival*ibuf;             \
            _sum[2*(i-ilo)+1] = rval*ibuf+ival*rbuf;           \
      }                                                        \
    }                                                          \
    free(_buf);                                                \
  }
  
  /* Make sure product vector is zero */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_v);
  /* multiply sparse matrix by sparse vector */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  vsum = (void*)malloc((ihi-ilo+1)*SPA[s_hdl].size);
  zflag = 1;
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (SPA[s_hdl].type == C_INT) {
          SPRS_REAL_MULTIPLY_M(int,iptr,jptr);
        } else if (SPA[s_hdl].type == C_LONG) {
          SPRS_REAL_MULTIPLY_M(long,iptr,jptr);
        } else if (SPA[s_hdl].type == C_LONGLONG) {
          SPRS_REAL_MULTIPLY_M(long long,iptr,jptr);
        } else if (SPA[s_hdl].type == C_FLOAT) {
          SPRS_REAL_MULTIPLY_M(float,iptr,jptr);
        } else if (SPA[s_hdl].type == C_DBL) {
          SPRS_REAL_MULTIPLY_M(double,iptr,jptr);
        } else if (SPA[s_hdl].type == C_SCPL) {
          SPRS_COMPLEX_MULTIPLY_M(float,iptr,jptr);
        } else if (SPA[s_hdl].type == C_DCPL) {
          SPRS_COMPLEX_MULTIPLY_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (SPA[s_hdl].type == C_INT) {
          SPRS_REAL_MULTIPLY_M(int,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_LONG) {
          SPRS_REAL_MULTIPLY_M(long,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_LONGLONG) {
          SPRS_REAL_MULTIPLY_M(long long,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_FLOAT) {
          SPRS_REAL_MULTIPLY_M(float,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_DBL) {
          SPRS_REAL_MULTIPLY_M(double,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_SCPL) {
          SPRS_COMPLEX_MULTIPLY_M(float,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_DCPL) {
          SPRS_COMPLEX_MULTIPLY_M(double,ilptr,jlptr);
        }
      }
    }
  }
#undef SPRS_REAL_MULTIPLY_M
#undef SPRS_COMPLEX_MULTIPLY_M

  if (ihi>=ilo) {
    klo = ilo + 1;
    khi = ihi + 1;
    pnga_acc(g_v,&klo,&khi,vsum,&one,&one_r);
  }
  if (local_sync_end)  pnga_pgroup_sync(s_grp);
  free(vsum);
}